

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  float fVar1;
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  undefined8 *puVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  stbi_uc *psVar11;
  float fVar12;
  double dVar13;
  
  if (data != (float *)0x0) {
    psVar3 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar3 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar9 = ((comp & 1U) + comp) - 1;
        lVar8 = (long)comp;
        uVar7 = 0;
        pfVar6 = data;
        psVar11 = psVar3;
        do {
          uVar2 = 0;
          if (0 < (int)uVar9) {
            uVar10 = 0;
            do {
              dVar13 = pow((double)(pfVar6[uVar10] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
              fVar12 = (float)dVar13 * 255.0 + 0.5;
              fVar1 = 0.0;
              if (0.0 <= fVar12) {
                fVar1 = fVar12;
              }
              fVar12 = 255.0;
              if (fVar1 <= 255.0) {
                fVar12 = fVar1;
              }
              psVar11[uVar10] = (stbi_uc)(int)fVar12;
              uVar10 = uVar10 + 1;
              uVar2 = uVar9;
            } while (uVar9 != uVar10);
          }
          if ((int)uVar2 < comp) {
            lVar4 = (ulong)uVar2 + uVar7 * lVar8;
            fVar12 = data[lVar4] * 255.0 + 0.5;
            fVar1 = 0.0;
            if (0.0 <= fVar12) {
              fVar1 = fVar12;
            }
            fVar12 = 255.0;
            if (fVar1 <= 255.0) {
              fVar12 = fVar1;
            }
            psVar3[lVar4] = (stbi_uc)(int)fVar12;
          }
          uVar7 = uVar7 + 1;
          pfVar6 = pfVar6 + lVar8;
          psVar11 = psVar11 + lVar8;
        } while (uVar7 != (uint)(y * x));
      }
      free(data);
      return psVar3;
    }
    free(data);
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_001f3f18);
    *puVar5 = "Out of memory";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}